

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsStatus __thiscall HEkk::setBasis(HEkk *this)

{
  double dVar1;
  double val;
  uint num_col;
  uint num_row;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int index;
  ulong uVar5;
  ulong uVar6;
  
  num_col = (this->lp_).num_col_;
  num_row = (this->lp_).num_row_;
  SimplexBasis::setup(&this->basis_,num_col,num_row);
  std::__cxx11::string::assign((char *)&(this->basis_).debug_origin_name);
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)num_col) {
    uVar5 = (ulong)num_col;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6] = '\x01';
    dVar1 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    val = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6];
    if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
      bVar2 = highs_isInfinity(-dVar1);
      bVar3 = highs_isInfinity(val);
      if (bVar2) {
        bVar4 = bVar3 - 1;
      }
      else {
        bVar4 = 1;
        if (!bVar3) {
          bVar4 = -(ABS(val) <= ABS(dVar1)) | 1;
        }
      }
    }
    else {
      bVar4 = 0;
    }
    (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6] = bVar4;
  }
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)num_row) {
    uVar5 = (ulong)num_row;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6 + (long)(int)num_col] = '\0';
    index = num_col + (int)uVar6;
    HighsHashHelpers::sparse_combine(&(this->basis_).hash,index);
    (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = index;
  }
  (this->info_).num_basic_logicals = num_row;
  (this->status_).has_basis = true;
  return kOk;
}

Assistant:

HighsStatus HEkk::setBasis() {
  // Set up nonbasicFlag and basicIndex for a logical basis
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_row = lp_.num_row_;

  basis_.setup(num_col, num_row);
  basis_.debug_origin_name = "HEkk::setBasis - logical";

  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    basis_.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
    double lower = lp_.col_lower_[iCol];
    double upper = lp_.col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed. Set to bound of LP that is closer to
        // zero
        if (move == kIllegalMoveValue) {
          if (fabs(lower) < fabs(upper)) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis_.nonbasicMove_[iCol] = move;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
    HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    basis_.basicIndex_[iRow] = iVar;
  }
  info_.num_basic_logicals = num_row;
  status_.has_basis = true;
  return HighsStatus::kOk;
}